

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O2

void __thiscall
iqxmlrpc::anon_unknown_7::StructBuilder::do_visit_element(StructBuilder *this,string *tagname)

{
  int iVar1;
  Value_type *pVVar2;
  Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  XML_RPC_violation *this_01;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = StateMachine::change(&this->state_,tagname);
  if (iVar1 != 1) {
    if (iVar1 == 3) {
      pVVar2 = BuilderBase::sub_build<iqxmlrpc::Value_type*,iqxmlrpc::ValueBuilder>
                         ((BuilderBase *)this,false);
      this->value_ = pVVar2;
      if (pVVar2 != (Value_type *)0x0) {
        return;
      }
      this_00 = (Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)operator_new(0x28);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
      Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Scalar(this_00,&local_38);
      this->value_ = (Value_type *)this_00;
    }
    else {
      if (iVar1 != 2) {
        this_01 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
        Parser::context_abi_cxx11_
                  (&local_38,(this->super_ValueBuilderBase).super_BuilderBase.parser_);
        XML_RPC_violation::XML_RPC_violation(this_01,&local_38);
        __cxa_throw(this_01,&XML_RPC_violation::typeinfo,std::runtime_error::~runtime_error);
      }
      Parser::get_data_abi_cxx11_
                (&local_38,(this->super_ValueBuilderBase).super_BuilderBase.parser_);
      std::__cxx11::string::operator=((string *)&this->name_,(string *)&local_38);
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

virtual void
  do_visit_element(const std::string& tagname)
  {
    switch (state_.change(tagname)) {
    case NAME_READ:
      name_ = parser_.get_data();
      break;

    case VALUE_READ:
      value_ = sub_build<Value_type*, ValueBuilder>();
      value_ = value_ ? value_ : new String("");
      break;

    case MEMBER:
      break;

    default:
      throw XML_RPC_violation(parser_.context());
    }
  }